

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O3

void __thiscall
Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::TagT<68u,Fixpp::Type::Int>>>::
parse<Fixpp::impl::TagSet<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)78>,Fixpp::Required<Fixpp::TagT<66u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<429u,Fixpp::Type::Int>>,Fixpp::Required<Fixpp::TagT<82u,Fixpp::Type::Int>>,Fixpp::Required<Fixpp::TagT<431u,Fixpp::Type::Int>>,Fixpp::Required<Fixpp::TagT<83u,Fixpp::Type::Int>>,Fixpp::TagT<444u,Fixpp::Type::String>,Fixpp::TagT<445u,Fixpp::Type::Int>,Fixpp::TagT<446u,Fixpp::Type::Data>,Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>,Fixpp::Required<Fixpp::TagT<68u,Fixpp::Type::Int>>,Fixpp::Required<Fixpp::SmallRepeatingGroup<Fixpp::TagT<73u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::Required<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<14u,Fixpp::Type::Float>>,Fixpp::Required<Fixpp::TagT<39u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<151u,Fixpp::Type::Float>>,Fixpp::Required<Fixpp::TagT<84u,Fixpp::Type::Float>>,Fixpp::Required<Fixpp::TagT<6u,Fixpp::Type::Float>>,Fixpp::TagT<103u,Fixpp::Type::Int>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>>>>
          (FieldParser<Fixpp::FieldRef<Fixpp::TagT<68u,Fixpp::Type::Int>>> *this,Field *field,
          ParsingContext *context,
          TagSet<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<_N_>,_Fixpp::Required<Fixpp::TagT<66U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<429U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<82U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<431U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<83U,_Fixpp::Type::Int>_>,_Fixpp::TagT<444U,_Fixpp::Type::String>,_Fixpp::TagT<445U,_Fixpp::Type::Int>,_Fixpp::TagT<446U,_Fixpp::Type::Data>,_Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<68U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::SmallRepeatingGroup<Fixpp::TagT<73U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<14U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<39U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<151U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<84U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<6U,_Fixpp::Type::Float>_>,_Fixpp::TagT<103U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>_>_>
          *tagSet,bool param_4,bool param_5)

{
  _WordT *p_Var1;
  StreamCursor *this_00;
  long lVar2;
  long lVar3;
  char cVar4;
  bool bVar5;
  char *pcVar6;
  long lVar7;
  char *pcVar8;
  char *pcVar9;
  Type type;
  StreamBuf<char> *pSVar10;
  
  this_00 = context->cursor;
  pSVar10 = this_00->buf;
  lVar2 = *(long *)&pSVar10->field_0x8;
  pcVar9 = *(char **)&pSVar10->field_0x10;
  pcVar6 = pcVar9;
  while( true ) {
    pcVar8 = *(char **)&pSVar10->field_0x18;
    if (pcVar8 == pcVar6) {
      lVar7 = (**(code **)(*(long *)pSVar10 + 0x38))();
      if (lVar7 == 0) {
        pcVar9 = "Expected value tag \'%d\', got EOF";
        type = ParsingError;
        goto LAB_0045ebaf;
      }
      pSVar10 = this_00->buf;
      pcVar6 = *(char **)&pSVar10->field_0x10;
      pcVar8 = *(char **)&pSVar10->field_0x18;
    }
    if (pcVar6 < pcVar8) {
      cVar4 = *pcVar6;
    }
    else {
      cVar4 = (**(code **)(*(long *)pSVar10 + 0x48))();
    }
    if (cVar4 == '|') break;
    StreamCursor::advance(this_00,1);
    pSVar10 = this_00->buf;
    pcVar6 = *(char **)&pSVar10->field_0x10;
  }
  lVar7 = *(long *)&this_00->buf->field_0x8;
  lVar3 = *(long *)&this_00->buf->field_0x10;
  bVar5 = StreamCursor::advance(this_00,1);
  if (bVar5) {
    (field->m_view).first = pcVar9;
    (field->m_view).second = (lVar2 + lVar3) - (long)(pcVar9 + lVar7);
    p_Var1 = (tagSet->
             super_TagSet<Fixpp::Required<Fixpp::TagT<66U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<429U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<82U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<431U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<83U,_Fixpp::Type::Int>_>,_Fixpp::TagT<444U,_Fixpp::Type::String>,_Fixpp::TagT<445U,_Fixpp::Type::Int>,_Fixpp::TagT<446U,_Fixpp::Type::Data>,_Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<68U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::SmallRepeatingGroup<Fixpp::TagT<73U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<14U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<39U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<151U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<84U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<6U,_Fixpp::Type::Float>_>,_Fixpp::TagT<103U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>_>
             ).bits.super__Base_bitset<7UL>._M_w + 1;
    *(byte *)p_Var1 = (byte)*p_Var1 | 0x10;
    return;
  }
  pcVar9 = "Expected value after tag \'%d\', got EOF";
  type = Incomplete;
LAB_0045ebaf:
  ParsingContext::setError(context,type,pcVar9,0x44);
  return;
}

Assistant:

void parse(Field& field, ParsingContext& context, TagSet& tagSet, bool /* strict */, bool /* skipUnknown */)
            {
                auto& cursor = context.cursor;
                // @Todo: In Strict mode, validate the type of the Tag
                StreamCursor::Token valueToken(context.cursor);
                TRY_MATCH_UNTIL(SOH, "Expected value tag '%d', got EOF", TagT::Id);

                auto view = valueToken.view();
                TRY_ADVANCE("Expected value after tag '%d', got EOF", TagT::Id);

                field.set(view);
                tagSet.set(field.tag());
            }